

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_print(lua_State *L)

{
  int iVar1;
  size_t local_30;
  size_t l;
  char *s;
  int i;
  int n;
  lua_State *L_local;
  
  _i = L;
  s._4_4_ = lua_gettop(L);
  lua_getglobal(_i,"tostring");
  s._0_4_ = 1;
  while( true ) {
    if (s._4_4_ < (int)s) {
      fwrite(anon_var_dwarf_79e0 + 5,1,1,_stdout);
      fflush(_stdout);
      return 0;
    }
    lua_pushvalue(_i,-1);
    lua_pushvalue(_i,(int)s);
    lua_callk(_i,1,1,0,(lua_KFunction)0x0);
    l = (size_t)lua_tolstring(_i,-1,&local_30);
    if ((char *)l == (char *)0x0) break;
    if (1 < (int)s) {
      fwrite("\t",1,1,_stdout);
    }
    fwrite((void *)l,1,local_30,_stdout);
    lua_settop(_i,-2);
    s._0_4_ = (int)s + 1;
  }
  iVar1 = luaL_error(_i,"\'tostring\' must return a string to \'print\'");
  return iVar1;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  lua_getglobal(L, "tostring");
  for (i=1; i<=n; i++) {
    const char *s;
    size_t l;
    lua_pushvalue(L, -1);  /* function to be called */
    lua_pushvalue(L, i);   /* value to print */
    lua_call(L, 1, 1);
    s = lua_tolstring(L, -1, &l);  /* get result */
    if (s == NULL)
      return luaL_error(L, "'tostring' must return a string to 'print'");
    if (i>1) lua_writestring("\t", 1);
    lua_writestring(s, l);
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}